

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetTemplateGlobalValueWithoutCopy::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  undefined4 uVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  TemplateDictionaryPeer peer;
  char value [32];
  TemplateString local_260;
  TemplateString local_240;
  TemplateString local_220;
  TemplateString local_200;
  TemplateDictionary dict;
  UnsafeArena arena;
  
  ctemplate::UnsafeArena::UnsafeArena(&arena,100);
  ctemplate::TemplateString::TemplateString((TemplateString *)value,"Test arena");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,(TemplateString *)value,&arena);
  builtin_strncpy(value,"value",6);
  uVar3 = value._0_4_;
  value._0_8_ = CONCAT44(value._4_4_,uVar3);
  peer.dict_ = &dict;
  pcVar5 = ctemplate::UnsafeArena::Alloc(&arena,0);
  ctemplate::TemplateString::TemplateString(&local_200,"key");
  ctemplate::TemplateString::TemplateString(&local_220,value);
  TVar1.length_ = local_200.length_;
  TVar1.ptr_ = local_200.ptr_;
  TVar1.is_immutable_ = local_200.is_immutable_;
  TVar1._17_7_ = local_200._17_7_;
  TVar1.id_ = local_200.id_;
  TVar2.length_ = local_220.length_;
  TVar2.ptr_ = local_220.ptr_;
  TVar2.is_immutable_ = local_220.is_immutable_;
  TVar2._17_7_ = local_220._17_7_;
  TVar2.id_ = local_220.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValueWithoutCopy(TVar1,TVar2);
  pcVar6 = ctemplate::UnsafeArena::Alloc(&arena,0);
  if (pcVar5 == pcVar6) {
    ctemplate::TemplateString::TemplateString(&local_240,"key");
    ctemplate::TemplateString::TemplateString(&local_260,"value");
    bVar4 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_240,&local_260);
    if (bVar4) {
      builtin_strncpy(value,"not_value",10);
      ctemplate::TemplateString::TemplateString(&local_240,"key");
      ctemplate::TemplateString::TemplateString(&local_260,"not_v");
      bVar4 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_240,&local_260);
      if (bVar4) {
        ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
        ctemplate::BaseArena::~BaseArena(&arena.super_BaseArena);
        return;
      }
      pcVar5 = "peer.ValueIs(\"key\", \"not_v\")";
    }
    else {
      pcVar5 = "peer.ValueIs(\"key\", \"value\")";
    }
    fprintf(_stderr,"Check failed: %s\n",pcVar5);
  }
  else {
    fprintf(_stderr,"Check failed: %s %s %s\n","ptr","==","arena.Alloc(0)");
  }
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetTemplateGlobalValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);
  TemplateDictionaryPeer peer(&dict);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetTemplateGlobalValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // "not_v" size == value" size
}